

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Counter.cpp
# Opt level: O0

uint32_t __thiscall Counter::Read(Counter *this,shared_ptr<myvk::CommandPool> *command_pool)

{
  initializer_list<VkBufferCopy> __l;
  element_type *this_00;
  uint32_t *puVar1;
  CommandBuffer *in_RDI;
  uint32_t ret;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  shared_ptr<myvk::Buffer> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint32_t uVar2;
  uint64_t in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff48;
  VkCommandBufferUsageFlags usage;
  vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *regions;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  iterator pVVar3;
  size_type sVar4;
  VkCommandBufferLevel in_stack_ffffffffffffffb4;
  Ptr<CommandPool> *in_stack_ffffffffffffffb8;
  CommandBuffer *in_stack_ffffffffffffffc0;
  allocator_type local_20 [32];
  
  usage = (VkCommandBufferUsageFlags)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  __a = local_20;
  myvk::CommandBuffer::Create(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x154e5a);
  myvk::CommandBuffer::Begin(in_RDI,usage);
  this_00 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x154e76);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
            );
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
            );
  pVVar3 = (iterator)0x0;
  sVar4 = 0;
  regions = (vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&stack0xffffffffffffff67;
  std::allocator<VkBufferCopy>::allocator((allocator<VkBufferCopy> *)0x154eda);
  __l._M_len = sVar4;
  __l._M_array = pVVar3;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),__l,__a);
  myvk::CommandBuffer::CmdCopy
            ((CommandBuffer *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (Ptr<BufferBase> *)__a,(Ptr<BufferBase> *)in_RDI,regions);
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::~vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)this_00);
  std::allocator<VkBufferCopy>::~allocator((allocator<VkBufferCopy> *)&stack0xffffffffffffff67);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x154f37);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x154f44);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x154f51);
  myvk::CommandBuffer::End((CommandBuffer *)0x154f59);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x154f68);
  myvk::CommandBuffer::Submit(in_stack_ffffffffffffffc0,(Ptr<Fence> *)in_stack_ffffffffffffffb8);
  std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x154f89)
  ;
  myvk::Fence::Wait((Fence *)this_00,in_stack_ffffffffffffff38);
  std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x154fa8)
  ;
  myvk::Fence::Reset((Fence *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x154fc0
            );
  puVar1 = (uint32_t *)
           myvk::Buffer::Map((Buffer *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                            );
  uVar2 = *puVar1;
  std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x154fe8
            );
  myvk::Buffer::Unmap((Buffer *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x155007);
  return uVar2;
}

Assistant:

uint32_t Counter::Read(const std::shared_ptr<myvk::CommandPool> &command_pool) const {
	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdCopy(m_buffer, m_staging_buffer, {{0, 0, sizeof(uint32_t)}});
	command_buffer->End();
	command_buffer->Submit(m_fence);
	m_fence->Wait();
	m_fence->Reset();
	uint32_t ret = *((uint32_t *)m_staging_buffer->Map());
	m_staging_buffer->Unmap();
	return ret;
}